

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3fca37::LoopReportController::collective_flush
          (LoopReportController *this,OutputStream *stream,Comm *comm)

{
  bool bVar1;
  int iVar2;
  StreamType SVar3;
  reference info;
  ostream *poVar4;
  string local_5a0;
  Log local_580;
  Comm local_378;
  reference local_370;
  LoopInfo *loopinfo;
  iterator __end4;
  iterator __begin4;
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
  *__range4;
  SnapshotProcessFn local_348;
  undefined1 local_328 [8];
  vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_> infovec;
  StringConverter local_2f0;
  byte local_2c9;
  undefined1 local_2c8 [7];
  bool print_timeseries;
  undefined1 local_2a8 [8];
  FormatProcessor formatter;
  StringConverter local_278;
  byte local_251;
  ostream *poStack_250;
  bool print_summary;
  ostream *os;
  SnapshotProcessFn local_238;
  undefined1 local_218 [8];
  Aggregator summary_cross_agg;
  QuerySpec summary_query_spec;
  Aggregator summary_local_agg;
  undefined1 local_50 [8];
  CaliperMetadataDB db;
  Caliper c;
  Comm *comm_local;
  OutputStream *stream_local;
  LoopReportController *this_local;
  
  cali::Caliper::Caliper((Caliper *)&db.mP);
  cali::CaliperMetadataDB::CaliperMetadataDB((CaliperMetadataDB *)local_50);
  summary_local_aggregation
            ((LoopReportController *)
             &summary_query_spec.preprocess_ops.
              super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Caliper *)this,
             (CaliperMetadataDB *)&db.mP);
  summary_query((QuerySpec *)
                &summary_cross_agg.mP.
                 super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,this);
  cali::Aggregator::Aggregator
            ((Aggregator *)local_218,
             (QuerySpec *)
             &summary_cross_agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)&local_238,(Aggregator *)local_218);
  cali::Aggregator::flush
            ((Aggregator *)
             &summary_query_spec.preprocess_ops.
              super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (CaliperMetadataAccessInterface *)local_50,&local_238);
  std::
  function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
  ::~function(&local_238);
  (*comm->_vptr_Comm[5])(comm,local_50,local_218);
  iVar2 = (*comm->_vptr_Comm[2])();
  if (iVar2 == 0) {
    SVar3 = cali::OutputStream::type(stream);
    if (SVar3 == None) {
      create_stream((LoopReportController *)&os);
      cali::OutputStream::operator=(stream,(OutputStream *)&os);
      cali::OutputStream::~OutputStream((OutputStream *)&os);
    }
    poStack_250 = cali::OutputStream::stream(stream);
    local_251 = 1;
    bVar1 = cali::ConfigManager::Options::is_set(&this->m_opts,"summary");
    if (bVar1) {
      cali::ConfigManager::Options::get_abi_cxx11_
                ((string *)
                 &formatter.mP.
                  super___shared_ptr<cali::FormatProcessor::FormatProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&this->m_opts,"summary","");
      cali::StringConverter::StringConverter
                (&local_278,
                 (string *)
                 &formatter.mP.
                  super___shared_ptr<cali::FormatProcessor::FormatProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      local_251 = cali::StringConverter::to_bool(&local_278,(bool *)0x0);
      cali::StringConverter::~StringConverter(&local_278);
      std::__cxx11::string::~string
                ((string *)
                 &formatter.mP.
                  super___shared_ptr<cali::FormatProcessor::FormatProcessorImpl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    if ((local_251 & 1) != 0) {
      std::operator<<(poStack_250,"\nLoop summary:\n------------\n\n");
      cali::FormatProcessor::FormatProcessor
                ((FormatProcessor *)local_2a8,
                 (QuerySpec *)
                 &summary_cross_agg.mP.
                  super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,stream);
      std::
      function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
      ::function<cali::FormatProcessor&,void>
                ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                  *)local_2c8,(FormatProcessor *)local_2a8);
      cali::Aggregator::flush
                ((Aggregator *)local_218,(CaliperMetadataAccessInterface *)local_50,
                 (SnapshotProcessFn *)local_2c8);
      std::
      function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
      ::~function((function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
                   *)local_2c8);
      cali::FormatProcessor::flush
                ((FormatProcessor *)local_2a8,(CaliperMetadataAccessInterface *)local_50);
      cali::FormatProcessor::~FormatProcessor((FormatProcessor *)local_2a8);
    }
  }
  local_2c9 = 1;
  bVar1 = cali::ConfigManager::Options::is_set(&this->m_opts,"timeseries");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_
              ((string *)
               &infovec.
                super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_opts,"timeseries","");
    cali::StringConverter::StringConverter
              (&local_2f0,
               (string *)
               &infovec.
                super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2c9 = cali::StringConverter::to_bool(&local_2f0,(bool *)0x0);
    cali::StringConverter::~StringConverter(&local_2f0);
    std::__cxx11::string::~string
              ((string *)
               &infovec.
                super__Vector_base<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if ((local_2c9 & 1) != 0) {
    std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
    vector((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
            *)local_328);
    __range4 = (vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                *)local_328;
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::
    function<(anonymous_namespace)::LoopReportController::collective_flush(cali::OutputStream&,cali::internal::CustomOutputController::Comm&)::_lambda(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)_1_,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)&local_348,(anon_class_8_1_f74f2f06 *)&__range4);
    cali::Aggregator::flush
              ((Aggregator *)local_218,(CaliperMetadataAccessInterface *)local_50,&local_348);
    std::
    function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
    ::~function(&local_348);
    bVar1 = std::
            vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
            ::empty((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                     *)local_328);
    if (bVar1) {
      cali::Log::Log(&local_580,1);
      poVar4 = cali::Log::stream(&local_580);
      cali::ChannelController::name_abi_cxx11_(&local_5a0,(ChannelController *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_5a0);
      poVar4 = std::operator<<(poVar4,": No instrumented loops found");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_5a0);
      cali::Log::~Log(&local_580);
    }
    else {
      __end4 = std::
               vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
               ::begin((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                        *)local_328);
      loopinfo = (LoopInfo *)
                 std::
                 vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                 ::end((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
                        *)local_328);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<(anonymous_namespace)::LoopInfo_*,_std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>_>
                                         *)&loopinfo), bVar1) {
        info = __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::LoopInfo_*,_std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>_>
               ::operator*(&__end4);
        local_370 = info;
        if (0 < info->iterations) {
          cali::internal::CustomOutputController::Comm::Comm(&local_378,comm);
          process_timeseries(this,(Caliper *)&db.mP,(CaliperMetadataDB *)local_50,stream,info,
                             &local_378);
          cali::internal::CustomOutputController::Comm::~Comm(&local_378);
        }
        __gnu_cxx::
        __normal_iterator<(anonymous_namespace)::LoopInfo_*,_std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>_>
        ::operator++(&__end4);
      }
    }
    std::vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>::
    ~vector((vector<(anonymous_namespace)::LoopInfo,_std::allocator<(anonymous_namespace)::LoopInfo>_>
             *)local_328);
  }
  cali::Aggregator::~Aggregator((Aggregator *)local_218);
  cali::QuerySpec::~QuerySpec
            ((QuerySpec *)
             &summary_cross_agg.mP.
              super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  cali::Aggregator::~Aggregator
            ((Aggregator *)
             &summary_query_spec.preprocess_ops.
              super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cali::CaliperMetadataDB::~CaliperMetadataDB((CaliperMetadataDB *)local_50);
  cali::Caliper::~Caliper((Caliper *)&db.mP);
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        Caliper           c;
        CaliperMetadataDB db;

        Aggregator summary_local_agg  = summary_local_aggregation(c, db);
        QuerySpec  summary_query_spec = summary_query();
        Aggregator summary_cross_agg(summary_query_spec);

        summary_local_agg.flush(db, summary_cross_agg);

        comm.cross_aggregate(db, summary_cross_agg);

        if (comm.rank() == 0) {
            if (stream.type() == OutputStream::None)
                stream = create_stream();

            std::ostream* os = stream.stream();

            bool print_summary = true;
            if (m_opts.is_set("summary"))
                print_summary = StringConverter(m_opts.get("summary")).to_bool();

            if (print_summary) {
                *os << "\nLoop summary:\n------------\n\n";

                FormatProcessor formatter(summary_query_spec, stream);
                summary_cross_agg.flush(db, formatter);
                formatter.flush(db);
            }
        }

        bool print_timeseries = true;
        if (m_opts.is_set("timeseries"))
            print_timeseries = StringConverter(m_opts.get("timeseries")).to_bool();

        if (print_timeseries) {
            std::vector<LoopInfo> infovec;

            summary_cross_agg.flush(db, [&infovec](CaliperMetadataAccessInterface& db, const EntryList& rec) {
                infovec.push_back(get_loop_info(db, rec));
            });

            if (!infovec.empty()) {
                for (const LoopInfo& loopinfo : infovec)
                    if (loopinfo.iterations > 0)
                        process_timeseries(c, db, stream, loopinfo, comm);
            } else {
                Log(1).stream() << name() << ": No instrumented loops found" << std::endl;
            }
        }
    }